

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O2

StringRef __thiscall
llvm::yaml::ScalarTraits<bool,_void>::input
          (ScalarTraits<bool,_void> *this,StringRef Scalar,void *param_2,bool *Val)

{
  bool bVar1;
  char *pcVar2;
  undefined1 uVar3;
  size_t sVar4;
  StringRef RHS;
  StringRef RHS_00;
  StringRef SVar5;
  undefined1 local_20 [8];
  StringRef Scalar_local;
  
  Scalar_local.Data = Scalar.Data;
  RHS.Length = 4;
  RHS.Data = "true";
  local_20 = (undefined1  [8])this;
  bVar1 = StringRef::equals((StringRef *)local_20,RHS);
  uVar3 = 1;
  if (!bVar1) {
    RHS_00.Length = 5;
    RHS_00.Data = "false";
    bVar1 = StringRef::equals((StringRef *)local_20,RHS_00);
    if (!bVar1) {
      pcVar2 = "invalid boolean";
      sVar4 = 0xf;
      goto LAB_00dcf20e;
    }
    uVar3 = 0;
  }
  *(undefined1 *)param_2 = uVar3;
  sVar4 = 0;
  pcVar2 = (char *)0x0;
LAB_00dcf20e:
  SVar5.Length = sVar4;
  SVar5.Data = pcVar2;
  return SVar5;
}

Assistant:

StringRef ScalarTraits<bool>::input(StringRef Scalar, void *, bool &Val) {
  if (Scalar.equals("true")) {
    Val = true;
    return StringRef();
  } else if (Scalar.equals("false")) {
    Val = false;
    return StringRef();
  }
  return "invalid boolean";
}